

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

int32_t * __thiscall
icu_63::ResourceDataValue::getIntVector
          (ResourceDataValue *this,int32_t *length,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t *iv;
  UErrorCode *errorCode_local;
  int32_t *length_local;
  ResourceDataValue *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this_local = (ResourceDataValue *)res_getIntVector_63(this->pResData,this->res,length);
    if (this_local == (ResourceDataValue *)0x0) {
      *errorCode = U_RESOURCE_TYPE_MISMATCH;
    }
  }
  else {
    this_local = (ResourceDataValue *)0x0;
  }
  return (int32_t *)this_local;
}

Assistant:

const int32_t *ResourceDataValue::getIntVector(int32_t &length, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    const int32_t *iv = res_getIntVector(pResData, res, &length);
    if(iv == NULL) {
        errorCode = U_RESOURCE_TYPE_MISMATCH;
    }
    return iv;
}